

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_def_io.c
# Opt level: O2

int32 model_def_read(model_def_t **out_model_def,char *file_name)

{
  model_def_entry_t *defn;
  int iVar1;
  int iVar2;
  acmod_id_t aVar3;
  int32 iVar4;
  uint uVar5;
  acmod_id_t left_context;
  acmod_id_t right_context;
  FILE *pFVar6;
  lineiter_t *li;
  model_def_t *pmVar7;
  acmod_set_t *acmod_set;
  char *pcVar8;
  byte *pbVar9;
  uint uVar10;
  char *fmt;
  long ln;
  uint32 *in_R8;
  uint32 *puVar11;
  uint32 uVar12;
  ulong uVar13;
  uint32 n_ci;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined8 in_stack_fffffffffffffec8;
  undefined4 uVar16;
  uint32 n_state;
  uint32 n;
  ulong local_118;
  model_def_t **local_110;
  uint32 local_108;
  uint32 tmat;
  FILE *local_100;
  model_def_t *local_f8;
  ulong local_f0;
  ulong local_e8;
  model_def_entry_t *local_e0;
  acmod_set_t *local_d8;
  ulong local_d0;
  char **local_c8;
  ulong local_c0;
  void *local_b8;
  model_def_entry_t *local_b0;
  char tag [32];
  uint32 state [20];
  
  pFVar6 = fopen(file_name,"r");
  iVar4 = -1;
  if (pFVar6 == (FILE *)0x0) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                   ,0x19d,"Unable to open %s for reading",file_name);
    return -1;
  }
  li = lineiter_start_clean((FILE *)pFVar6);
  if (li == (lineiter_t *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
            ,0x1a6,"ERROR not even a version number in %s!?\n",file_name);
    fclose(pFVar6);
    li = (lineiter_t *)0x0;
  }
  else {
    pcVar8 = li->buf;
    local_110 = out_model_def;
    iVar1 = strcmp(pcVar8,"0.3");
    if (iVar1 == 0) {
      iVar1 = 6;
      local_108 = 0xffffffff;
      local_f0 = CONCAT44(local_f0._4_4_,0xffffffff);
      local_f8 = (model_def_t *)CONCAT44(local_f8._4_4_,0xffffffff);
      local_e8 = 0xffffffff;
      local_118 = CONCAT44(local_118._4_4_,0xffffffff);
      local_100 = pFVar6;
      local_d0 = local_e8;
      while( true ) {
        li = lineiter_next(li);
        bVar14 = iVar1 == 0;
        iVar1 = iVar1 + -1;
        if (bVar14) break;
        if (li == (lineiter_t *)0x0) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                  ,0x1c5,"Incomplete count information in %s!?\n",file_name);
          fclose(local_100);
          li = (lineiter_t *)0x0;
          goto LAB_00103b53;
        }
        __isoc99_sscanf(li->buf,"%u %s",&n,tag);
        iVar2 = bcmp(tag,"n_base",7);
        if (iVar2 == 0) {
          local_e8 = (ulong)n;
        }
        else {
          iVar2 = bcmp(tag,"n_tri",6);
          if (iVar2 == 0) {
            local_d0 = (ulong)n;
          }
          else {
            iVar2 = bcmp(tag,"n_state_map",0xc);
            if (iVar2 == 0) {
              local_108 = n;
            }
            else {
              iVar2 = bcmp(tag,"n_tied_state",0xd);
              if (iVar2 == 0) {
                local_f8 = (model_def_t *)CONCAT44(local_f8._4_4_,n);
              }
              else {
                auVar15[0] = -(tag[0] == 'n');
                auVar15[1] = -(tag[1] == '_');
                auVar15[2] = -(tag[2] == 't');
                auVar15[3] = -(tag[3] == 'i');
                auVar15[4] = -(tag[4] == 'e');
                auVar15[5] = -(tag[5] == 'd');
                auVar15[6] = -(tag[6] == '_');
                auVar15[7] = -(tag[7] == 'c');
                auVar15[8] = -(tag[8] == 'i');
                auVar15[9] = -(tag[9] == '_');
                auVar15[10] = -(tag[10] == 's');
                auVar15[0xb] = -(tag[0xb] == 't');
                auVar15[0xc] = -(tag[0xc] == 'a');
                auVar15[0xd] = -(tag[0xd] == 't');
                auVar15[0xe] = -(tag[0xe] == 'e');
                auVar15[0xf] = -(tag[0xf] == '\0');
                if ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                            (ushort)(auVar15[0xf] >> 7) << 0xf) == 0xffff) {
                  local_118 = CONCAT44(local_118._4_4_,n);
                }
                else {
                  iVar2 = bcmp(tag,"n_tied_tmat",0xc);
                  if (iVar2 != 0) {
                    uVar5 = lineiter_lineno(li);
                    fmt = "Unknown tag %s in file at line %d\n";
                    pcVar8 = tag;
                    ln = 0x1e2;
                    uVar13 = (ulong)uVar5;
                    goto LAB_00103b3f;
                  }
                  local_f0 = CONCAT44(local_f0._4_4_,n);
                }
              }
            }
          }
        }
      }
      pmVar7 = (model_def_t *)
               __ckd_calloc__(1,0x48,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                              ,0x1ec);
      *local_110 = pmVar7;
      acmod_set = acmod_set_new();
      uVar13 = local_e8;
      pmVar7->acmod_set = acmod_set;
      n_ci = (uint32)local_e8;
      acmod_set_set_n_ci_hint(acmod_set,n_ci);
      uVar12 = (uint32)local_d0;
      acmod_set_set_n_tri_hint(acmod_set,uVar12);
      local_c0 = (ulong)(uVar12 + n_ci);
      local_b0 = (model_def_entry_t *)
                 __ckd_calloc__(local_c0,0x20,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                                ,0x1f5);
      pmVar7->defn = local_b0;
      pmVar7->n_total_state = local_108;
      local_b8 = __ckd_calloc__((ulong)local_108,4,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                                ,0x1f8);
      pmVar7->n_tied_ci_state = (uint32)local_118;
      pmVar7->n_tied_state = (uint32)local_f8;
      pmVar7->n_tied_tmat = (uint32)local_f0;
      pmVar7->max_n_state = 0;
      pmVar7->min_n_state = 0x14;
      local_118 = uVar13 & 0xffffffff;
      local_110 = (model_def_t **)((ulong)local_110 & 0xffffffff00000000);
      local_f0 = 0;
      local_f8 = pmVar7;
      local_d8 = acmod_set;
      while (local_f0 != local_118) {
        n_state = 0x14;
        pcVar8 = li->buf;
        uVar5 = lineiter_lineno(li);
        pcVar8 = strtok(pcVar8," \t");
        aVar3 = acmod_set_name2id(acmod_set,pcVar8);
        if (aVar3 != 0xffffffff) {
          fmt = "%s multiply defined at line %d\n";
          ln = 0xa7;
          uVar13 = (ulong)uVar5;
          goto LAB_00103b3f;
        }
        iVar1 = 4;
        puVar11 = in_R8;
        while (iVar1 = iVar1 + -1, iVar1 != 0) {
          pbVar9 = (byte *)strtok((char *)0x0," \t");
          uVar10 = *pbVar9 - 0x2d;
          if (uVar10 == 0) {
            uVar10 = (uint)pbVar9[1];
          }
          if (uVar10 != 0) {
            fmt = 
            "Expected l, r and posn to be \"-\" for ci phone %s at line %d, currently \'%s\'\n";
            ln = 0xae;
            uVar13 = (ulong)uVar5;
            goto LAB_00103b3f;
          }
        }
        in_R8 = state;
        iVar4 = parse_rem(&local_c8,&tmat,in_R8,&n_state,(uint32)puVar11);
        acmod_set = local_d8;
        if (iVar4 != 0) goto LAB_00103b46;
        aVar3 = acmod_set_add_ci(local_d8,pcVar8,local_c8);
        uVar13 = local_f0;
        uVar12 = n_state;
        local_e0 = local_b0 + local_f0;
        local_b0[local_f0].p = aVar3;
        local_b0[local_f0].tmat = tmat;
        local_b0[local_f0].n_state = n_state;
        iVar1 = (uint32)local_110;
        puVar11 = (uint32 *)((long)local_b8 + ((ulong)local_110 & 0xffffffff) * 4);
        local_b0[local_f0].state = puVar11;
        memcpy(puVar11,in_R8,(ulong)n_state << 2);
        update_totals(local_f8,local_e0);
        li = lineiter_next(li);
        local_110 = (model_def_t **)CONCAT44(local_110._4_4_,iVar1 + uVar12);
        local_f0 = uVar13 + 1;
      }
      if ((uint)local_f0 <= (uint)local_c0) {
        local_f0 = local_c0;
      }
      local_f0 = local_f0 & 0xffffffff;
      uVar13 = local_e8 & 0xffffffff;
      while( true ) {
        pmVar7 = local_f8;
        pFVar6 = local_100;
        uVar16 = (undefined4)((ulong)in_stack_fffffffffffffec8 >> 0x20);
        uVar12 = (uint32)in_R8;
        if ((int)uVar13 == (int)local_f0) break;
        local_e0 = (model_def_entry_t *)CONCAT44(local_e0._4_4_,(int)uVar13);
        n_state = 0x14;
        pcVar8 = li->buf;
        uVar5 = lineiter_lineno(li);
        pcVar8 = strtok(pcVar8," \t");
        aVar3 = acmod_set_name2id(acmod_set,pcVar8);
        if (aVar3 == 0xffffffff) {
          fmt = "%s is an undefined base phone at line %d\n";
          ln = 0xd0;
          uVar13 = (ulong)uVar5;
          goto LAB_00103b3f;
        }
        local_118 = CONCAT44(local_118._4_4_,uVar5);
        pcVar8 = strtok((char *)0x0," \t");
        left_context = acmod_set_name2id(acmod_set,pcVar8);
        if (left_context == 0xffffffff) {
          ln = 0xda;
LAB_00103f0a:
          fmt = "%s is an undefined base phone at line %d\n";
LAB_00103d8a:
          uVar13 = local_118 & 0xffffffff;
LAB_00103b3f:
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                  ,ln,fmt,pcVar8,uVar13);
LAB_00103b46:
          fclose(local_100);
LAB_00103b53:
          lineiter_free(li);
          return -1;
        }
        pcVar8 = strtok((char *)0x0," \t");
        right_context = acmod_set_name2id(acmod_set,pcVar8);
        if (right_context == 0xffffffff) {
          ln = 0xe4;
          goto LAB_00103f0a;
        }
        pcVar8 = strtok((char *)0x0," \t");
        uVar13 = 0;
        while( true ) {
          if (uVar13 == 5) {
            fmt = "Unknown word posn %s found at line %d\n";
            ln = 0xf5;
            goto LAB_00103d8a;
          }
          if (*pcVar8 == "besiu"[uVar13]) break;
          uVar13 = uVar13 + 1;
        }
        iVar4 = parse_rem(&local_c8,&tmat,state,&n_state,uVar12);
        if (iVar4 != 0) goto LAB_00103b46;
        in_R8 = (uint32 *)(uVar13 & 0xffffffff);
        aVar3 = acmod_set_add_tri(local_d8,aVar3,left_context,right_context,(word_posn_t)uVar13,
                                  local_c8);
        if (aVar3 == 0xffffffff) goto LAB_00103b46;
        iVar2 = (int)local_e0;
        uVar13 = (ulong)local_e0 & 0xffffffff;
        defn = local_b0 + uVar13;
        local_b0[uVar13].p = aVar3;
        local_b0[uVar13].tmat = tmat;
        local_b0[uVar13].n_state = n_state;
        iVar1 = (uint32)local_110;
        puVar11 = (uint32 *)((long)local_b8 + ((ulong)local_110 & 0xffffffff) * 4);
        local_b0[uVar13].state = puVar11;
        memcpy(puVar11,state,(ulong)n_state << 2);
        update_totals(local_f8,defn);
        li = lineiter_next(li);
        uVar13 = (ulong)(iVar2 + 1);
        local_110 = (model_def_t **)CONCAT44(local_110._4_4_,iVar1 + n_state);
        acmod_set = local_d8;
      }
      local_f8->n_defn = (uint32)local_c0;
      if ((uint32)local_110 != local_108) {
        __assert_fail("j == n_total_map",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                      ,0x23b,"int32 model_def_read(model_def_t **, const char *)");
      }
      iVar4 = 0;
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
              ,0x23d,"Model definition info:\n");
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
              ,0x23e,"%u total models defined (%u base, %u tri)\n",(ulong)pmVar7->n_defn,local_e8,
              CONCAT44(uVar16,(int)local_d0));
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
              ,0x23f,"%u total states\n",(ulong)pmVar7->n_total_state);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
              ,0x240,"%u total tied states\n",(ulong)pmVar7->n_tied_state);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
              ,0x241,"%u total tied CI states\n",(ulong)pmVar7->n_tied_ci_state);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
              ,0x242,"%u total tied transition matrices\n",(ulong)pmVar7->n_tied_tmat);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
              ,0x243,"%u max state/model\n",(ulong)pmVar7->max_n_state);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
              ,0x244,"%u min state/model\n",(ulong)pmVar7->min_n_state);
      fclose(pFVar6);
    }
    else {
      iVar1 = lineiter_lineno(li);
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
              ,0x1b0,"ERROR version(%s) == \"%s\", but expected %s at line %d.\n",file_name,pcVar8,
              "0.3",iVar1);
      fclose(pFVar6);
      pcVar8 = li->buf;
      iVar1 = strcmp(pcVar8,"0.1");
      if (iVar1 == 0) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                ,0x1b5,
                "You must add an attribute field to all the model records.  See SPHINX-III File Formats manual\n"
               );
        pcVar8 = li->buf;
      }
      iVar1 = strcmp(pcVar8,"0.2");
      if (iVar1 == 0) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                ,0x1b9,
                "You must add n_tied_state, n_tied_ci_state and n_tied_tmat definitions at the head of the file.  See /net/alf19/usr2/eht/s3/cvtmdef.csh\n"
               );
      }
    }
  }
  lineiter_free(li);
  return iVar4;
}

Assistant:

int32
model_def_read(model_def_t **out_model_def,
	       const char *file_name)
{
    lineiter_t *li = NULL;
    uint32 n;
    char tag[32];
    acmod_set_t *acmod_set;
    uint32 i, j;
    acmod_id_t acmod_id;
    uint32 tmat;
    uint32 n_state;
    uint32 n_tri;
    uint32 n_base;
    uint32 n_total_map;
    uint32 n_tied_state;
    uint32 n_tied_ci_state;
    uint32 n_tied_tmat;
    uint32 state[MAX_N_STATE];
    uint32 n_total;
    model_def_t *omd;
    model_def_entry_t *mdef;
    uint32 *all_state;
    uint32 max_tmat;
    uint32 max_state;
    uint32 max_ci_state;
    
    FILE *fp;

    fp = fopen(file_name, "r");
    if (fp == NULL) {
	E_ERROR_SYSTEM("Unable to open %s for reading",
		      file_name);

	return S3_ERROR;
    }
    
    li = lineiter_start_clean(fp);

    if (li == NULL) {
	E_ERROR("ERROR not even a version number in %s!?\n",
		file_name);

	fclose(fp);

        lineiter_free(li);
	return S3_ERROR;
    }

    if (strcmp(li->buf, MODEL_DEF_VERSION) != 0) {
	E_ERROR("ERROR version(%s) == \"%s\", but expected %s at line %d.\n",
		file_name, li->buf, MODEL_DEF_VERSION, lineiter_lineno(li));

	fclose(fp);
	
	if (strcmp(li->buf, "0.1") == 0) {
	    E_ERROR("You must add an attribute field to all the model records.  See SPHINX-III File Formats manual\n");
	}
	
	if (strcmp(li->buf, "0.2") == 0) {
	    E_ERROR("You must add n_tied_state, n_tied_ci_state and n_tied_tmat definitions at the head of the file.  See /net/alf19/usr2/eht/s3/cvtmdef.csh\n");
	}
	
        lineiter_free(li);
	return S3_ERROR;
    }

    n_tri = n_base = n_total_map = n_tied_state = n_tied_ci_state = n_tied_tmat = NO_NUMBER;
    for ( i = 0; i < 6; i++) {
        li = lineiter_next(li);
        if (li == NULL) {
	    E_ERROR("Incomplete count information in %s!?\n",
		    file_name);
	    
	    fclose(fp);
            lineiter_free(li);
	    return S3_ERROR;
	}

	sscanf(li->buf, "%u %s", &n, tag);

	if (strcmp(tag, "n_base") == 0) {
	    n_base = n;
	}	
	else if (strcmp(tag, "n_tri") == 0) {
	    n_tri = n;
	}
	else if (strcmp(tag, "n_state_map") == 0) {
	    n_total_map = n;
	}
	else if (strcmp(tag, "n_tied_state") == 0) {
	    n_tied_state = n;
	}
	else if (strcmp(tag, "n_tied_ci_state") == 0) {
	    n_tied_ci_state = n;
	}
	else if (strcmp(tag, "n_tied_tmat") == 0) {
	    n_tied_tmat = n;
	}
	else {
	    E_ERROR("Unknown tag %s in file at line %d\n",
		    tag, lineiter_lineno(li));
	    	    
	    fclose(fp);

            lineiter_free(li);
	    return S3_ERROR;
	}
    }
    li = lineiter_next(li);

    *out_model_def = omd = ckd_calloc(1, sizeof(model_def_t));
    omd->acmod_set = acmod_set = acmod_set_new();

    /* give the acmod_set module some storage allocation requirements */
    acmod_set_set_n_ci_hint(acmod_set, n_base);
    acmod_set_set_n_tri_hint(acmod_set, n_tri);

    n_total = n_base + n_tri;

    omd->defn = mdef = ckd_calloc(n_total, sizeof(model_def_entry_t));
    omd->n_total_state = n_total_map;

    all_state = ckd_calloc(n_total_map, sizeof(uint32));
    
    omd->n_tied_ci_state = n_tied_ci_state;
    omd->n_tied_state = n_tied_state;
    omd->n_tied_tmat = n_tied_tmat;

    omd->max_n_state = 0;
    omd->min_n_state = MAX_N_STATE;

    for (i = 0, j = 0, max_state = 0, max_ci_state = 0, max_tmat = 0;
	 i < n_base; i++, j += n_state) {
	n_state = MAX_N_STATE;
	if (parse_base_line(li->buf,
			    lineiter_lineno(li),
	                    &acmod_id,
			    &tmat,
			    state,
			    &n_state,
			    acmod_set) != S3_SUCCESS) {

	    fclose(fp);
            lineiter_free(li);
            return S3_ERROR;
	}

	mdef[i].p = acmod_id;
	mdef[i].tmat = tmat;
	mdef[i].n_state = n_state;
	mdef[i].state = &all_state[j];

	memcpy((char *)mdef[i].state, (const char *)state,
	       n_state * sizeof(uint32));

	update_totals(omd, &mdef[i]);

	li = lineiter_next(li);
    }

    for (; i < n_total; i++, j += n_state) {
	n_state = MAX_N_STATE;

	if (parse_tri_line(li->buf,
			   lineiter_lineno(li),
			   &acmod_id,
			   &tmat,
			   state,
			   &n_state,
			   acmod_set) != S3_SUCCESS) {
	    fclose(fp);
            lineiter_free(li);
	    return S3_ERROR;
	}

	mdef[i].p = acmod_id;
	mdef[i].tmat = tmat;
	mdef[i].n_state = n_state;
	mdef[i].state = &all_state[j];
	memcpy((char *)mdef[i].state,
	       (const char *)state,
	       n_state * sizeof(uint32));

	update_totals(omd, &mdef[i]);
	li = lineiter_next(li);
    }

    omd->n_defn = n_total;

    assert(j == n_total_map);
    
    E_INFO("Model definition info:\n");
    E_INFO("%u total models defined (%u base, %u tri)\n", omd->n_defn, n_base, n_tri);
    E_INFO("%u total states\n", omd->n_total_state);
    E_INFO("%u total tied states\n", omd->n_tied_state);
    E_INFO("%u total tied CI states\n", omd->n_tied_ci_state);
    E_INFO("%u total tied transition matrices\n", omd->n_tied_tmat);
    E_INFO("%u max state/model\n", omd->max_n_state);
    E_INFO("%u min state/model\n", omd->min_n_state);

    fclose(fp);

    lineiter_free(li);
    return S3_SUCCESS;
}